

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O0

void bonk_print(t_bonk *x,t_floatarg f)

{
  int iVar1;
  t_hist *local_30;
  t_hist *h;
  t_insig *gp;
  int ninsig;
  int j;
  int i;
  t_floatarg f_local;
  t_bonk *x_local;
  
  post("thresh %f %f",(double)x->x_lothresh);
  post("mask %d %f",(double)x->x_maskdecay,(ulong)(uint)x->x_masktime);
  post("attack-frames %d",(ulong)(uint)x->x_attackbins);
  post("debounce %f",(double)x->x_debouncedecay);
  post("minvel %f",(double)x->x_minvel);
  post("spew %d",(ulong)(uint)x->x_spew);
  post("useloudness %d",(ulong)(uint)x->x_useloudness);
  post("number of templates %d",(ulong)(uint)x->x_ntemplate);
  if (x->x_learn != 0) {
    post("learn mode");
  }
  if ((f != 0.0) || (NAN(f))) {
    iVar1 = x->x_ninsig;
    gp._4_4_ = 0;
    h = x->x_insig->g_hist;
    for (; (int)gp._4_4_ < iVar1; gp._4_4_ = gp._4_4_ + 1) {
      if (1 < iVar1) {
        post("input %d:",(ulong)(gp._4_4_ + 1));
      }
      local_30 = h;
      ninsig = x->x_nfilters;
      while (ninsig != 0) {
        post("pow %f mask %f before %f count %d",(double)local_30->h_power,
             (double)local_30->h_mask[x->x_maskphase],(double)local_30->h_before,
             (ulong)(uint)local_30->h_countup);
        local_30 = local_30 + 1;
        ninsig = ninsig + -1;
      }
      h = (t_hist *)(h[200].h_mask + 2);
    }
    post("bin size %.2f Hz ... filters:",(double)(x->x_sr / (float)x->x_npoints));
    for (gp._4_4_ = 0; (int)gp._4_4_ < x->x_nfilters; gp._4_4_ = gp._4_4_ + 1) {
      post("    %2d  cf %.2f(%.2f bins) bw %.2f(%.2f) nhops %d hop %d skip %d npoints %d",
           (double)((x->x_filterbank->b_vec[(int)gp._4_4_].k_centerfreq * x->x_sr) /
                   (float)x->x_npoints),(double)x->x_filterbank->b_vec[(int)gp._4_4_].k_centerfreq,
           (double)((x->x_filterbank->b_vec[(int)gp._4_4_].k_bandwidth * x->x_sr) /
                   (float)x->x_npoints),(double)x->x_filterbank->b_vec[(int)gp._4_4_].k_bandwidth,
           (ulong)gp._4_4_,(ulong)(uint)x->x_filterbank->b_vec[(int)gp._4_4_].k_nhops,
           (ulong)(uint)x->x_filterbank->b_vec[(int)gp._4_4_].k_hoppoints,
           (ulong)(uint)x->x_filterbank->b_vec[(int)gp._4_4_].k_skippoints,
           (ulong)(uint)x->x_filterbank->b_vec[(int)gp._4_4_].k_filterpoints);
    }
  }
  if (x->x_debug != 0) {
    post("debug mode");
  }
  return;
}

Assistant:

static void bonk_print(t_bonk *x, t_floatarg f)
{
    int i;
    post("thresh %f %f", x->x_lothresh, x->x_hithresh);
    post("mask %d %f", x->x_masktime, x->x_maskdecay);
    post("attack-frames %d", x->x_attackbins);
    post("debounce %f", x->x_debouncedecay);
    post("minvel %f", x->x_minvel);
    post("spew %d", x->x_spew);
    post("useloudness %d", x->x_useloudness);
    
#if 0       /* LATER rewrite without hard-coded 11 filters */
    if (x->x_ntemplate)
    {
        post("templates:");
        for (i = 0; i < x->x_ntemplate; i++)
            post(
"%2d %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f %5.2f",
                i,
                x->x_template[i].t_amp[0],
                x->x_template[i].t_amp[1],
                x->x_template[i].t_amp[2],
                x->x_template[i].t_amp[3],
                x->x_template[i].t_amp[4],
                x->x_template[i].t_amp[5],
                x->x_template[i].t_amp[6],
                x->x_template[i].t_amp[7],
                x->x_template[i].t_amp[8],
                x->x_template[i].t_amp[9],
                x->x_template[i].t_amp[10]);
    }
    else post("no templates");
#endif
    post("number of templates %d", x->x_ntemplate);
    if (x->x_learn) post("learn mode");
    if (f != 0)
    {
        int j, ninsig = x->x_ninsig;
        t_insig *gp;
        for (j = 0, gp = x->x_insig; j < ninsig; j++, gp++)
        {
            t_hist *h;
            if (ninsig > 1) post("input %d:", j+1);
            for (i = x->x_nfilters, h = gp->g_hist; i--; h++)
                post("pow %f mask %f before %f count %d",
                     h->h_power, h->h_mask[x->x_maskphase],
                     h->h_before, h->h_countup);
        }
        post("bin size %.2f Hz ... filters:",
             x->x_sr/x->x_npoints);
        for (j = 0; j < x->x_nfilters; j++)
            post("\
    %2d  cf %.2f(%.2f bins) bw %.2f(%.2f) nhops %d hop %d skip %d npoints %d",
                 j, 
                 x->x_filterbank->b_vec[j].k_centerfreq*x->x_sr/x->x_npoints,
                 x->x_filterbank->b_vec[j].k_centerfreq,
                 x->x_filterbank->b_vec[j].k_bandwidth*x->x_sr/x->x_npoints,
                 x->x_filterbank->b_vec[j].k_bandwidth,
                 x->x_filterbank->b_vec[j].k_nhops,
                 x->x_filterbank->b_vec[j].k_hoppoints,
                 x->x_filterbank->b_vec[j].k_skippoints,
                 x->x_filterbank->b_vec[j].k_filterpoints);
    }
    if (x->x_debug) post("debug mode");
}